

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O3

void __thiscall entityx::EntityManager::remove<Position>(EntityManager *this,Id id)

{
  ulong *puVar1;
  long *plVar2;
  byte bVar3;
  Family FVar4;
  ComponentHandle<Position,_entityx::EntityManager> component;
  Entity local_40;
  ComponentHandle<Position,_entityx::EntityManager> local_30;
  
  FVar4 = Component<Position>::family();
  plVar2 = *(long **)(*(long *)(this + 0x18) + FVar4 * 8);
  local_40.manager_ = this;
  local_40.id_.id_ = id.id_;
  local_30.manager_ = this;
  local_30.id_.id_ = id.id_;
  EventManager::
  emit<entityx::ComponentRemovedEvent<Position>,entityx::Entity,entityx::ComponentHandle<Position,entityx::EntityManager>&>
            (*(EventManager **)(this + 0x10),&local_40,&local_30);
  if (FVar4 < 0x40) {
    bVar3 = (byte)FVar4 & 0x3f;
    puVar1 = (ulong *)(*(long *)(this + 0x48) + (id.id_ & 0xffffffff) * 8);
    *puVar1 = *puVar1 & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
    (**(code **)(*plVar2 + 0x10))(plVar2);
    return;
  }
  std::__throw_out_of_range_fmt
            ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::reset",FVar4,0x40);
}

Assistant:

void remove(Entity::Id id) {
    assert_valid(id);
    const BaseComponent::Family family = component_family<C>();
    const uint32_t index = id.index();

    // Find the pool for this component family.
    BasePool *pool = component_pools_[family];
    ComponentHandle<C> component(this, id);
    event_manager_.emit<ComponentRemovedEvent<C>>(Entity(this, id), component);

    // Remove component bit.
    entity_component_mask_[id.index()].reset(family);

    // Call destructor.
    pool->destroy(index);
  }